

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

void __thiscall duckdb::SingleFileBlockManager::LoadExistingDatabase(SingleFileBlockManager *this)

{
  string *psVar1;
  FileBuffer *block;
  bool bVar2;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var3;
  FileSystem *pFVar4;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> _Var5;
  type handle;
  idx_t iVar6;
  CatalogException *pCVar7;
  IOException *this_00;
  long lVar8;
  DatabaseHeader *header;
  FileOpenFlags FVar9;
  DatabaseHeader local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  MainHeader main_header;
  DatabaseHeader local_68;
  
  FVar9 = GetFileFlags(this,false);
  pFVar4 = FileSystem::Get(this->db);
  psVar1 = &this->path;
  (*pFVar4->_vptr_FileSystem[2])(&main_header,pFVar4,psVar1,FVar9.flags,(ulong)FVar9._8_2_,0);
  _Var5._M_head_impl = (FileHandle *)main_header.version_number;
  main_header.version_number = 0;
  _Var3._M_head_impl =
       (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
       ._M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (this->handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
  .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var3._M_head_impl != (FileHandle *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_FileHandle + 8))();
    if (main_header.version_number != 0) {
      (**(code **)(*(long *)main_header.version_number + 8))();
    }
    _Var5._M_head_impl =
         (this->handle).
         super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
         super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
         super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  }
  if (_Var5._M_head_impl != (FileHandle *)0x0) {
    handle = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
             operator*(&this->handle);
    MainHeader::CheckMagicBytes(handle);
    block = &this->header_buffer;
    lVar8 = 0;
    ReadAndChecksum(this,block,0,true);
    iVar6 = BlockManager::GetBlockHeaderSize(&this->super_BlockManager);
    if (8 < iVar6) {
      iVar6 = BlockManager::GetBlockHeaderSize(&this->super_BlockManager);
      lVar8 = 8 - iVar6;
    }
    DeserializeMainHeader(&main_header,(this->header_buffer).buffer + lVar8);
    bVar2 = (this->options).encryption;
    if (main_header.flags[0] == 1) {
      if (bVar2 == false) {
        pCVar7 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_168,"Cannot open encrypted database \"%s\" without a key",
                   (allocator *)&local_68);
        ::std::__cxx11::string::string((string *)&local_110,(string *)psVar1);
        CatalogException::CatalogException<std::__cxx11::string>
                  (pCVar7,(string *)&local_168,&local_110);
        __cxa_throw(pCVar7,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else if (bVar2 != false) {
      pCVar7 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_168,"A key is specified, but database \"%s\" is not encrypted",
                 (allocator *)&local_68);
      ::std::__cxx11::string::string((string *)&local_130,(string *)psVar1);
      CatalogException::CatalogException<std::__cxx11::string>
                (pCVar7,(string *)&local_168,&local_130);
      __cxa_throw(pCVar7,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_idx::optional_idx((optional_idx *)&local_168,main_header.version_number);
    (this->options).version_number.index = local_168.iteration;
    ReadAndChecksum(this,block,0x1000,false);
    DeserializeDatabaseHeader(&local_168,&main_header,(this->header_buffer).buffer);
    ReadAndChecksum(this,block,0x2000,false);
    DeserializeDatabaseHeader(&local_68,&main_header,(this->header_buffer).buffer);
    this->active_header = local_168.iteration <= local_68.iteration;
    header = &local_168;
    if (local_168.iteration <= local_68.iteration) {
      header = &local_68;
    }
    Initialize(this,header,(optional_idx)(this->super_BlockManager).block_alloc_size.index);
    AddStorageVersionTag(this);
    LoadFreeList(this);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&main_header,
             "Cannot open database \"%s\" in read-only mode: database does not exist",
             (allocator *)&local_168);
  ::std::__cxx11::string::string((string *)&local_f0,(string *)psVar1);
  IOException::IOException<std::__cxx11::string>(this_00,(string *)&main_header,&local_f0);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::LoadExistingDatabase() {
	auto flags = GetFileFlags(false);

	// open the RDBMS handle
	auto &fs = FileSystem::Get(db);
	handle = fs.OpenFile(path, flags);
	if (!handle) {
		// this can only happen in read-only mode - as that is when we set FILE_FLAGS_NULL_IF_NOT_EXISTS
		throw IOException("Cannot open database \"%s\" in read-only mode: database does not exist", path);
	}

	MainHeader::CheckMagicBytes(*handle);
	// otherwise, we check the metadata of the file
	ReadAndChecksum(header_buffer, 0, true);

	uint64_t delta = 0;
	if (GetBlockHeaderSize() > DEFAULT_BLOCK_HEADER_STORAGE_SIZE) {
		delta = GetBlockHeaderSize() - DEFAULT_BLOCK_HEADER_STORAGE_SIZE;
	}

	MainHeader main_header = DeserializeMainHeader(header_buffer.buffer - delta);

	if (main_header.IsEncrypted() && !options.NeedsEncryption()) {
		throw CatalogException("Cannot open encrypted database \"%s\" without a key", path);
	}
	if (!main_header.IsEncrypted() && options.NeedsEncryption()) {
		// database is not encrypted, but is tried to be opened with a key
		throw CatalogException("A key is specified, but database \"%s\" is not encrypted", path);
	}

	options.version_number = main_header.version_number;

	// read the database headers from disk
	DatabaseHeader h1;
	ReadAndChecksum(header_buffer, Storage::FILE_HEADER_SIZE);
	h1 = DeserializeDatabaseHeader(main_header, header_buffer.buffer);

	DatabaseHeader h2;
	ReadAndChecksum(header_buffer, Storage::FILE_HEADER_SIZE * 2ULL);
	h2 = DeserializeDatabaseHeader(main_header, header_buffer.buffer);

	// check the header with the highest iteration count
	if (h1.iteration > h2.iteration) {
		// h1 is active header
		active_header = 0;
		Initialize(h1, GetOptionalBlockAllocSize());
	} else {
		// h2 is active header
		active_header = 1;
		Initialize(h2, GetOptionalBlockAllocSize());
	}
	AddStorageVersionTag();
	LoadFreeList();
}